

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O0

void __thiscall Personality::~Personality(Personality *this)

{
  bool bVar1;
  reference ppFVar2;
  reference ppIVar3;
  _Self local_50;
  _List_node_base *local_48;
  _List_iterator<Item_*> local_40;
  iterator iti;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<Follower_*> local_18;
  iterator itf;
  Personality *this_local;
  
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_0012b2d8;
  itf._M_node = (_List_node_base *)this;
  std::_List_iterator<Follower_*>::_List_iterator(&local_18);
  local_20 = (_List_node_base *)
             std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::begin(&this->followers);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::end(&this->followers);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppFVar2 = std::_List_iterator<Follower_*>::operator*(&local_18);
    std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::remove
              (&this->followers,(char *)ppFVar2);
    ppFVar2 = std::_List_iterator<Follower_*>::operator*(&local_18);
    if (*ppFVar2 != (Follower *)0x0) {
      (*((*ppFVar2)->super_GreenCard).super_Card._vptr_Card[3])();
    }
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::begin(&this->followers);
    iti._M_node = (_List_node_base *)std::_List_iterator<Follower_*>::operator++(&local_18,0);
  }
  std::_List_iterator<Item_*>::_List_iterator(&local_40);
  local_48 = (_List_node_base *)
             std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::begin(&this->items);
  local_40._M_node = local_48;
  while( true ) {
    local_50._M_node =
         (_List_node_base *)std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::end(&this->items);
    bVar1 = std::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    ppIVar3 = std::_List_iterator<Item_*>::operator*(&local_40);
    std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::remove(&this->items,(char *)ppIVar3);
    ppIVar3 = std::_List_iterator<Item_*>::operator*(&local_40);
    if (*ppIVar3 != (Item *)0x0) {
      (*((*ppIVar3)->super_GreenCard).super_Card._vptr_Card[3])();
    }
    local_40._M_node =
         (_List_node_base *)std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::begin(&this->items)
    ;
    std::_List_iterator<Item_*>::operator++(&local_40,0);
  }
  std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::~list(&this->items);
  std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::~list(&this->followers);
  std::__cxx11::string::~string((string *)&this->name);
  BlackCard::~BlackCard(&this->super_BlackCard);
  return;
}

Assistant:

Personality::~Personality()
{
    list<Follower*>::iterator itf;
    for (itf = followers.begin(); itf != followers.end(); itf++)
    {
        followers.remove((*itf));
        delete *itf;
        itf = followers.begin();
    }

    list<Item*>::iterator iti;
    for (iti = items.begin(); iti != items.end(); iti++)
    {
        items.remove((*iti));
        delete *iti;
        iti = items.begin();
    }
}